

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

void __thiscall
Lodtalk::ClassTable::addSpecialClass(ClassTable *this,ClassDescription *description,size_t index)

{
  pointer ppOVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  SharedMutex::write_lock(&this->sharedMutex);
  uVar3 = index >> 9;
  ppOVar1 = (this->pageTable).super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->pageTable).
                super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3;
  if (uVar2 <= uVar3) {
    lVar4 = (uVar3 - uVar2) + 1;
    do {
      allocatePage(this);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    ppOVar1 = (this->pageTable).super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  ppOVar1[uVar3][(uint)index & 0x1ff].field_0.header = (ObjectHeader *)description;
  uVar2 = index + 1;
  if (index + 1 < this->size) {
    uVar2 = this->size;
  }
  this->size = uVar2;
  (description->super_Behavior).super_Object.super_ProtoObject.object_header_ =
       (ObjectHeader)
       ((ulong)(description->super_Behavior).super_Object.super_ProtoObject.object_header_ &
        0xffffffff000003ff | (ulong)((uint)index << 10));
  SharedMutex::write_unlock(&this->sharedMutex);
  return;
}

Assistant:

void ClassTable::addSpecialClass(ClassDescription *description, size_t index)
{
    WriteLock<SharedMutex> l(sharedMutex);
    auto pageIndex = index / OopsPerPage;
    auto elementIndex = index % OopsPerPage;

    for(size_t i = pageTable.size(); i < pageIndex + 1; ++i)
        allocatePage();

    pageTable[pageIndex][elementIndex] = Oop::fromPointer(description);
    size = std::max(size, index + 1);
    description->object_header_.identityHash = (unsigned int)index;
}